

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

char * iutest::TestEnv::get_color_option(void)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = TestFlag::IsEnableFlag(0x400);
  if (bVar1) {
    pcVar2 = "ansi";
  }
  else {
    bVar1 = TestFlag::IsEnableFlag(0x100);
    if (bVar1) {
      pcVar2 = "yes";
    }
    else {
      bVar1 = TestFlag::IsEnableFlag(0x200);
      pcVar2 = "auto";
      if (bVar1) {
        pcVar2 = "no";
      }
    }
  }
  return pcVar2;
}

Assistant:

static const char* get_color_option()
    {
        if( TestFlag::IsEnableFlag(TestFlag::CONSOLE_COLOR_ANSI) )
        {
            return "ansi";
        }
        else if( TestFlag::IsEnableFlag(TestFlag::CONSOLE_COLOR_ON) )
        {
            return "yes";
        }
        else if( TestFlag::IsEnableFlag(TestFlag::CONSOLE_COLOR_OFF) )
        {
            return "no";
        }
        return "auto";
    }